

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdLoadSplat<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  Simd<unsigned_char,_(unsigned_char)__x10_> value;
  RunResult RVar1;
  uchar *__first;
  uchar *__last;
  uchar local_50 [8];
  Simd<unsigned_char,_(unsigned_char)__x10_> result;
  uchar local_21;
  Ptr *pPStack_20;
  L val;
  Ptr *out_trap_local;
  Thread *this_local;
  
  result.v._8_8_ = instr._0_8_;
  pPStack_20 = out_trap;
  out_trap_local = (Ptr *)this;
  RVar1 = Load<unsigned_char>(this,instr,&local_21,out_trap);
  if (RVar1 == Ok) {
    __first = std::begin<unsigned_char,16ul>((uchar (*) [16])local_50);
    __last = std::end<unsigned_char,16ul>((uchar (*) [16])local_50);
    std::fill<unsigned_char*,unsigned_char>(__first,__last,&local_21);
    value.v[8] = result.v[0];
    value.v[9] = result.v[1];
    value.v[10] = result.v[2];
    value.v[0xb] = result.v[3];
    value.v[0xc] = result.v[4];
    value.v[0xd] = result.v[5];
    value.v[0xe] = result.v[6];
    value.v[0xf] = result.v[7];
    value.v[0] = local_50[0];
    value.v[1] = local_50[1];
    value.v[2] = local_50[2];
    value.v[3] = local_50[3];
    value.v[4] = local_50[4];
    value.v[5] = local_50[5];
    value.v[6] = local_50[6];
    value.v[7] = local_50[7];
    Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,value);
    this_local._4_4_ = Ok;
  }
  else {
    this_local._4_4_ = Trap;
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoSimdLoadSplat(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}